

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O2

CURLcode imap_do(connectdata *conn,_Bool *done)

{
  curl_mimepart *part;
  uint *puVar1;
  Curl_easy *pCVar2;
  void *pvVar3;
  undefined4 *puVar4;
  imapstate iVar5;
  bool bVar6;
  _Bool *p_Var7;
  connectdata *conn_00;
  _Bool _Var8;
  char cVar9;
  CURLcode CVar10;
  int iVar11;
  curl_off_t cVar12;
  char *pcVar13;
  size_t sVar14;
  char *pcVar15;
  char *pcVar16;
  _Bool *p_Var17;
  Curl_easy *data;
  long lVar18;
  char *pcVar19;
  char *value;
  char *name;
  size_t local_48;
  _Bool *local_40;
  connectdata *local_38;
  
  *done = false;
  pCVar2 = conn->data;
  pvVar3 = (pCVar2->req).protop;
  pcVar16 = (pCVar2->state).path;
  lVar18 = 1;
  pcVar19 = pcVar16 + -1;
  local_40 = done;
  local_38 = conn;
  do {
    pcVar15 = pcVar19;
    pcVar19 = pcVar15 + 1;
    _Var8 = imap_is_bchar(pcVar15[1]);
    lVar18 = lVar18 + -1;
  } while (_Var8);
  if (lVar18 == 0) {
    *(undefined8 *)((long)pvVar3 + 8) = 0;
  }
  else {
    pcVar13 = pcVar19;
    if ((pcVar16 < pcVar19) && (pcVar13 = pcVar15, *pcVar15 != '/')) {
      pcVar13 = pcVar19;
    }
    CVar10 = Curl_urldecode(pCVar2,pcVar16,(long)pcVar13 - (long)pcVar16,(char **)((long)pvVar3 + 8)
                            ,(size_t *)0x0,true);
    if (CVar10 != CURLE_OK) {
      return CVar10;
    }
  }
  while( true ) {
    cVar9 = *pcVar19;
    if (cVar9 != ';') break;
    pcVar16 = pcVar19 + 1;
    pcVar15 = pcVar19 + 2;
    sVar14 = 0;
    pcVar19 = pcVar16;
    while( true ) {
      if (pcVar15[-1] == '\0') {
        return CURLE_URL_MALFORMAT;
      }
      if (pcVar15[-1] == '=') break;
      pcVar15 = pcVar15 + 1;
      sVar14 = sVar14 + 1;
      pcVar19 = pcVar19 + 1;
    }
    CVar10 = Curl_urldecode(pCVar2,pcVar16,sVar14,&name,(size_t *)0x0,true);
    if (CVar10 != CURLE_OK) {
      return CVar10;
    }
    sVar14 = 0xffffffffffffffff;
    do {
      pcVar16 = pcVar19 + 1;
      pcVar19 = pcVar19 + 1;
      _Var8 = imap_is_bchar(*pcVar16);
      sVar14 = sVar14 + 1;
    } while (_Var8);
    CVar10 = Curl_urldecode(pCVar2,pcVar15,sVar14,&value,&local_48,true);
    if (CVar10 != CURLE_OK) {
      (*Curl_cfree)(name);
      return CVar10;
    }
    iVar11 = Curl_strcasecompare(name,"UIDVALIDITY");
    if ((iVar11 == 0) || (*(long *)((long)pvVar3 + 0x10) != 0)) {
      iVar11 = Curl_strcasecompare(name,"UID");
      if ((iVar11 == 0) || (*(long *)((long)pvVar3 + 0x18) != 0)) {
        iVar11 = Curl_strcasecompare(name,"SECTION");
        if ((iVar11 == 0) || (*(long *)((long)pvVar3 + 0x20) != 0)) {
          iVar11 = Curl_strcasecompare(name,"PARTIAL");
          if ((iVar11 == 0) || (*(long *)((long)pvVar3 + 0x28) != 0)) {
            (*Curl_cfree)(name);
            (*Curl_cfree)(value);
            return CURLE_URL_MALFORMAT;
          }
          if ((local_48 != 0) && (value[local_48 - 1] == '/')) {
            value[local_48 - 1] = '\0';
          }
          *(char **)((long)pvVar3 + 0x28) = value;
        }
        else {
          if ((local_48 != 0) && (value[local_48 - 1] == '/')) {
            value[local_48 - 1] = '\0';
          }
          *(char **)((long)pvVar3 + 0x20) = value;
        }
      }
      else {
        if ((local_48 != 0) && (value[local_48 - 1] == '/')) {
          value[local_48 - 1] = '\0';
        }
        *(char **)((long)pvVar3 + 0x18) = value;
      }
    }
    else {
      if ((local_48 != 0) && (value[local_48 - 1] == '/')) {
        value[local_48 - 1] = '\0';
      }
      *(char **)((long)pvVar3 + 0x10) = value;
    }
    value = (char *)0x0;
    (*Curl_cfree)(name);
    (*Curl_cfree)(value);
  }
  if (((*(long *)((long)pvVar3 + 8) != 0) && (cVar9 == '?')) &&
     (*(long *)((long)pvVar3 + 0x18) == 0)) {
    sVar14 = 0xffffffffffffffff;
    do {
      _Var8 = imap_is_bchar(pcVar19[sVar14 + 2]);
      sVar14 = sVar14 + 1;
    } while (_Var8);
    CVar10 = Curl_urldecode(pCVar2,pcVar19 + 1,sVar14,(char **)((long)pvVar3 + 0x30),(size_t *)0x0,
                            true);
    if (CVar10 != CURLE_OK) {
      return CVar10;
    }
    cVar9 = (pcVar19 + 1)[sVar14];
  }
  conn_00 = local_38;
  if (cVar9 != '\0') {
    return CURLE_URL_MALFORMAT;
  }
  pCVar2 = local_38->data;
  pcVar16 = (pCVar2->set).str[6];
  if (pcVar16 != (char *)0x0) {
    pvVar3 = (pCVar2->req).protop;
    CVar10 = Curl_urldecode(pCVar2,pcVar16,0,(char **)((long)pvVar3 + 0x38),(size_t *)0x0,true);
    if (CVar10 != CURLE_OK) {
      return CVar10;
    }
    pcVar16 = *(char **)((long)pvVar3 + 0x38);
    for (pcVar19 = pcVar16; *pcVar19 != '\0'; pcVar19 = pcVar19 + 1) {
      if (*pcVar19 == ' ') {
        pcVar19 = (*Curl_cstrdup)(pcVar19);
        *(char **)((long)pvVar3 + 0x40) = pcVar19;
        *pcVar16 = '\0';
        if (*(long *)((long)pvVar3 + 0x40) == 0) {
          return CURLE_OUT_OF_MEMORY;
        }
        break;
      }
      pcVar16 = pcVar16 + 1;
    }
  }
  pCVar2 = conn_00->data;
  (pCVar2->req).size = -1;
  Curl_pgrsSetUploadCounter(pCVar2,0);
  Curl_pgrsSetDownloadCounter(pCVar2,0);
  Curl_pgrsSetUploadSize(pCVar2,-1);
  Curl_pgrsSetDownloadSize(pCVar2,-1);
  pCVar2 = conn_00->data;
  puVar4 = (undefined4 *)(pCVar2->req).protop;
  if ((pCVar2->set).opt_no_body == true) {
    *puVar4 = 1;
  }
  *local_40 = false;
  if ((((*(char **)(puVar4 + 2) == (char *)0x0) ||
       (pcVar16 = (conn_00->proto).imapc.mailbox, pcVar16 == (char *)0x0)) ||
      (iVar11 = Curl_strcasecompare(*(char **)(puVar4 + 2),pcVar16), iVar11 == 0)) ||
     (((*(char **)(puVar4 + 4) != (char *)0x0 &&
       (pcVar16 = (conn_00->proto).imapc.mailbox_uidvalidity, pcVar16 != (char *)0x0)) &&
      (iVar11 = Curl_strcasecompare(*(char **)(puVar4 + 4),pcVar16), iVar11 == 0)))) {
    bVar6 = false;
  }
  else {
    bVar6 = true;
  }
  data = conn_00->data;
  if (((data->set).upload != false) || ((pCVar2->set).mimepost.kind != MIMEKIND_NONE)) {
    pvVar3 = (data->req).protop;
    if (*(long *)((long)pvVar3 + 8) == 0) {
      pcVar16 = "Cannot APPEND without a mailbox.";
      goto LAB_0012fbcc;
    }
    if ((data->set).mimepost.kind == MIMEKIND_NONE) {
      cVar12 = (data->state).infilesize;
    }
    else {
      part = &(data->set).mimepost;
      puVar1 = &(data->set).mimepost.flags;
      *(byte *)puVar1 = (byte)*puVar1 & 0xfd;
      curl_mime_headers(part,(data->set).headers,0);
      CVar10 = Curl_mime_prepare_headers(part,(char *)0x0,(char *)0x0,MIMESTRATEGY_MAIL);
      if (CVar10 != CURLE_OK) {
        return CVar10;
      }
      pcVar16 = Curl_checkheaders(conn_00,"Mime-Version");
      if ((pcVar16 == (char *)0x0) &&
         (CVar10 = Curl_mime_add_header(&(data->set).mimepost.curlheaders,"Mime-Version: 1.0"),
         CVar10 != CURLE_OK)) {
        return CVar10;
      }
      CVar10 = Curl_mime_rewind(part);
      if (CVar10 != CURLE_OK) {
        return CVar10;
      }
      cVar12 = Curl_mime_size(part);
      (data->state).infilesize = cVar12;
      (data->state).fread_func = Curl_mime_read;
      (data->state).in = part;
    }
    if (cVar12 < 0) {
      Curl_failf(data,"Cannot APPEND with unknown input file size\n");
      return CURLE_UPLOAD_FAILED;
    }
    pcVar16 = imap_atom(*(char **)((long)pvVar3 + 8),false);
    if (pcVar16 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    CVar10 = imap_sendf(conn_00,"APPEND %s (\\Seen) {%ld}",pcVar16,(data->state).infilesize);
    (*Curl_cfree)(pcVar16);
    if (CVar10 != CURLE_OK) {
      return CVar10;
    }
    iVar5 = IMAP_APPEND;
LAB_0012fc2f:
    (conn_00->proto).imapc.state = iVar5;
    goto LAB_0012fd7c;
  }
  if (*(long *)(puVar4 + 0xe) == 0) {
    if (!bVar6) {
      if (*(long *)(puVar4 + 2) != 0) {
        if (*(long *)(puVar4 + 6) == 0) {
          lVar18 = *(long *)(puVar4 + 0xc);
          goto joined_r0x0012fcc4;
        }
        goto LAB_0012fcca;
      }
      goto LAB_0012fd6a;
    }
    if (*(long *)(puVar4 + 6) == 0) {
      if (*(long *)(puVar4 + 0xc) == 0) goto LAB_0012fd6a;
      CVar10 = imap_perform_search(conn_00);
    }
    else {
      CVar10 = imap_perform_fetch(conn_00);
    }
  }
  else {
    if (!bVar6) {
      lVar18 = *(long *)(puVar4 + 2);
joined_r0x0012fcc4:
      if (lVar18 != 0) {
LAB_0012fcca:
        pvVar3 = (data->req).protop;
        (*Curl_cfree)((conn_00->proto).imapc.mailbox);
        (conn_00->proto).imapc.mailbox = (char *)0x0;
        (*Curl_cfree)((conn_00->proto).imapc.mailbox_uidvalidity);
        (conn_00->proto).imapc.mailbox_uidvalidity = (char *)0x0;
        pcVar16 = *(char **)((long)pvVar3 + 8);
        if (pcVar16 == (char *)0x0) {
          data = conn_00->data;
          pcVar16 = "Cannot SELECT without a mailbox.";
LAB_0012fbcc:
          Curl_failf(data,pcVar16);
          return CURLE_URL_MALFORMAT;
        }
        pcVar16 = imap_atom(pcVar16,false);
        if (pcVar16 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        CVar10 = imap_sendf(conn_00,"SELECT %s",pcVar16);
        (*Curl_cfree)(pcVar16);
        if (CVar10 != CURLE_OK) {
          return CVar10;
        }
        iVar5 = IMAP_SELECT;
        goto LAB_0012fc2f;
      }
    }
LAB_0012fd6a:
    CVar10 = imap_perform_list(conn_00);
  }
  if (CVar10 != CURLE_OK) {
    return CVar10;
  }
LAB_0012fd7c:
  p_Var7 = local_40;
  p_Var17 = local_40;
  CVar10 = imap_multi_statemach(conn_00,local_40);
  if ((CVar10 == CURLE_OK) && (CVar10 = CURLE_OK, *p_Var7 == true)) {
    imap_dophase_done(conn_00,SUB81(p_Var17,0));
  }
  return CVar10;
}

Assistant:

static CURLcode imap_do(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;

  *done = FALSE; /* default to false */

  /* Parse the URL path */
  result = imap_parse_url_path(conn);
  if(result)
    return result;

  /* Parse the custom request */
  result = imap_parse_custom_request(conn);
  if(result)
    return result;

  result = imap_regular_transfer(conn, done);

  return result;
}